

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_algebraic.hpp
# Opt level: O1

Opers chaiscript::Operators::to_operator(string *t_str,bool t_is_unary)

{
  int iVar1;
  Opers OVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)t_str);
  if (iVar1 == 0) {
    OVar2 = equals;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)t_str);
    if (iVar1 == 0) {
      OVar2 = less_than;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)t_str);
      if (iVar1 == 0) {
        OVar2 = greater_than;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)t_str);
        if (iVar1 == 0) {
          OVar2 = less_than_equal;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)t_str);
          if (iVar1 == 0) {
            OVar2 = greater_than_equal;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)t_str);
            if (iVar1 == 0) {
              OVar2 = not_equal;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)t_str);
              if (iVar1 == 0) {
                OVar2 = assign;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)t_str);
                if (iVar1 == 0) {
                  OVar2 = pre_increment;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)t_str);
                  if (iVar1 == 0) {
                    OVar2 = pre_decrement;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)t_str);
                    if (iVar1 == 0) {
                      OVar2 = assign_product;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)t_str);
                      if (iVar1 == 0) {
                        OVar2 = assign_sum;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)t_str);
                        if (iVar1 == 0) {
                          OVar2 = assign_difference;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)t_str);
                          if (iVar1 == 0) {
                            OVar2 = assign_bitwise_and;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)t_str);
                            if (iVar1 == 0) {
                              OVar2 = assign_bitwise_or;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)t_str);
                              if (iVar1 == 0) {
                                OVar2 = assign_shift_left;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)t_str);
                                if (iVar1 == 0) {
                                  OVar2 = assign_shift_right;
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)t_str);
                                  if (iVar1 == 0) {
                                    OVar2 = assign_remainder;
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare((char *)t_str);
                                    if (iVar1 == 0) {
                                      OVar2 = assign_bitwise_xor;
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare((char *)t_str);
                                      if (iVar1 == 0) {
                                        OVar2 = shift_left;
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare((char *)t_str);
                                        if (iVar1 == 0) {
                                          OVar2 = shift_right;
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare((char *)t_str);
                                          if (iVar1 == 0) {
                                            OVar2 = remainder;
                                          }
                                          else {
                                            iVar1 = std::__cxx11::string::compare((char *)t_str);
                                            if (iVar1 == 0) {
                                              OVar2 = bitwise_and;
                                            }
                                            else {
                                              iVar1 = std::__cxx11::string::compare((char *)t_str);
                                              if (iVar1 == 0) {
                                                OVar2 = bitwise_or;
                                              }
                                              else {
                                                iVar1 = std::__cxx11::string::compare((char *)t_str)
                                                ;
                                                if (iVar1 == 0) {
                                                  OVar2 = bitwise_xor;
                                                }
                                                else {
                                                  iVar1 = std::__cxx11::string::compare
                                                                    ((char *)t_str);
                                                  if (iVar1 == 0) {
                                                    OVar2 = bitwise_complement;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)t_str);
                                                    if (iVar1 == 0) {
                                                      OVar2 = (uint)t_is_unary * 4 + sum;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)t_str);
                                                      if (iVar1 == 0) {
                                                        OVar2 = (uint)t_is_unary * 2 + difference;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)t_str);
                                                        if (iVar1 == 0) {
                                                          OVar2 = quotient;
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)t_str);
                                                          OVar2 = (uint)(iVar1 != 0) * 4 + product;
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return OVar2;
}

Assistant:

static Opers to_operator(const std::string &t_str, bool t_is_unary = false)
    {
      if (t_str == "==")
      {
        return equals;
      } else if (t_str == "<") {
        return less_than;
      } else if (t_str == ">") {
        return greater_than;
      } else if (t_str == "<=") {
        return less_than_equal; 
      } else if (t_str == ">=") {
        return greater_than_equal;
      } else if (t_str == "!=") {
        return not_equal;
      } else if (t_str == "=") {
        return assign;
      } else if (t_str == "++") {
        return pre_increment;
      } else if (t_str == "--") {
        return pre_decrement;
      } else if (t_str == "*=") {
        return assign_product;
      } else if (t_str == "+=") {
        return assign_sum;
      } else if (t_str == "-=") {
        return assign_difference;
      } else if (t_str == "&=") {
        return assign_bitwise_and;
      } else if (t_str == "|=") {
        return assign_bitwise_or;
      } else if (t_str == "<<=") {
        return assign_shift_left;
      } else if (t_str == ">>=") {
        return assign_shift_right;
      } else if (t_str == "%=") {
        return assign_remainder;
      } else if (t_str == "^=") {
        return assign_bitwise_xor;
      } else if (t_str == "<<") {
        return shift_left;
      } else if (t_str == ">>") {
        return shift_right;
      } else if (t_str == "%") {
        return remainder;
      } else if (t_str == "&") { 
        return bitwise_and;
      } else if (t_str == "|") {
        return bitwise_or;
      } else if (t_str == "^") {
        return bitwise_xor;
      } else if (t_str == "~") {
        return bitwise_complement;
      } else if (t_str == "+") {
        if (t_is_unary) {
          return unary_plus;
        } else {
          return sum;
        }
      } else if (t_str == "-") {
        if (t_is_unary) {
          return unary_minus;
        } else {
          return difference;
        }
      } else if (t_str == "/") {
        return quotient;
      } else if (t_str == "*") {
        return product;
      } else {
        return invalid;
      } 
    }